

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

int parse_data(char *filepath,LYD_FORMAT informat,int *options,lyd_node *val_tree,char *rpc_act_file
              ,lyd_node **result)

{
  char *__s1;
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  long lVar4;
  lyd_node *plVar5;
  int *piVar6;
  uint uVar7;
  
  uVar7 = *options;
  if (informat == LYD_UNKNOWN) {
    informat = detect_data_format(filepath);
  }
  if (informat == LYD_UNKNOWN) {
    parse_data_cold_11();
    return 1;
  }
  puVar2 = (undefined4 *)ly_errno_glob_address();
  *puVar2 = 0;
  if ((uVar7 & 0x10000ff) == 0x10000ff) {
    if (informat != LYD_XML) {
      parse_data_cold_4();
      return 1;
    }
    lVar3 = lyxml_parse_path(ctx,filepath,0);
    if (lVar3 == 0) {
      parse_data_cold_10();
      return 1;
    }
    __s1 = *(char **)(lVar3 + 0x30);
    iVar1 = strcmp(__s1,"data");
    if (iVar1 == 0) {
      lVar4 = 0;
      fprintf(_stdout,"Parsing %s as complete datastore.\n",filepath);
      uVar7 = uVar7 & 0xfefdff00 | 0x20000;
    }
    else {
      iVar1 = strcmp(__s1,"config");
      if (iVar1 == 0) {
        lVar4 = 0;
        fprintf(_stdout,"Parsing %s as config data.\n",filepath);
        uVar7 = uVar7 & 0xfeffff01;
      }
      else {
        iVar1 = strcmp(__s1,"get-reply");
        if (iVar1 == 0) {
          lVar4 = 0;
          fprintf(_stdout,"Parsing %s as <get> reply data.\n",filepath);
          uVar7 = uVar7 & 0xfeffff02;
        }
        else {
          iVar1 = strcmp(__s1,"get-config-reply");
          if (iVar1 == 0) {
            lVar4 = 0;
            fprintf(_stdout,"Parsing %s as <get-config> reply data.\n",filepath);
            uVar7 = uVar7 & 0xfeffff04;
          }
          else {
            iVar1 = strcmp(__s1,"edit-config");
            if (iVar1 == 0) {
              lVar4 = 0;
              fprintf(_stdout,"Parsing %s as <edit-config> data.\n",filepath);
              uVar7 = uVar7 & 0xfeffff08;
            }
            else {
              iVar1 = strcmp(__s1,"rpc");
              if (iVar1 == 0) {
                lVar4 = 0;
                fprintf(_stdout,"Parsing %s as <rpc> data.\n",filepath);
                uVar7 = uVar7 & 0xfeffff10;
              }
              else {
                iVar1 = strcmp(__s1,"rpc-reply");
                if (iVar1 == 0) {
                  if (rpc_act_file == (char *)0x0) {
                    parse_data_cold_8();
                    return 1;
                  }
                  fprintf(_stdout,"Parsing %s as <rpc-reply> data.\n",filepath);
                  lVar4 = lyd_parse_path(ctx,rpc_act_file,1,0x10,val_tree);
                  if (lVar4 == 0) {
                    parse_data_cold_7();
                    return 1;
                  }
                  uVar7 = uVar7 & 0xfeffff20;
                }
                else {
                  iVar1 = strcmp(__s1,"notification");
                  if (iVar1 == 0) {
                    lVar4 = 0;
                    fprintf(_stdout,"Parsing %s as <notification> data.\n",filepath);
                    uVar7 = uVar7 & 0xfeffff40;
                  }
                  else {
                    iVar1 = strcmp(__s1,"yang-data");
                    if (iVar1 != 0) {
                      parse_data_cold_5();
                      return 1;
                    }
                    lVar4 = 0;
                    fprintf(_stdout,"Parsing %s as <yang-data> data.\n",filepath);
                    if (rpc_act_file == (char *)0x0) {
                      parse_data_cold_6();
                      return 1;
                    }
                    uVar7 = uVar7 & 0xffffff00;
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((uVar7 & 0x20) == 0) {
      if (((uVar7 & 0x50) == 0) && (val_tree = (lyd_node *)rpc_act_file, (uVar7 >> 0x18 & 1) == 0))
      {
        plVar5 = (lyd_node *)lyd_parse_xml(ctx,lVar3 + 0x18,uVar7,rpc_act_file);
      }
      else {
        plVar5 = (lyd_node *)lyd_parse_xml(ctx,lVar3 + 0x18,uVar7,val_tree);
      }
    }
    else {
      plVar5 = (lyd_node *)lyd_parse_xml(ctx,lVar3 + 0x18,uVar7,lVar4);
    }
    lyxml_free(ctx,lVar3);
  }
  else if ((uVar7 & 0x20) == 0) {
    if ((uVar7 & 0x50) == 0) {
      if ((uVar7 >> 0x18 & 1) == 0) {
        if ((uVar7 & 0x10000ff) == 0) {
          uVar7 = uVar7 | 0x20000;
        }
        lVar4 = 0;
        plVar5 = (lyd_node *)lyd_parse_path(ctx,filepath,informat,uVar7);
        goto LAB_00108e57;
      }
      val_tree = (lyd_node *)rpc_act_file;
      if (rpc_act_file == (char *)0x0) {
        parse_data_cold_3();
        return 1;
      }
    }
    lVar4 = 0;
    plVar5 = (lyd_node *)lyd_parse_path(ctx,filepath,informat,uVar7,val_tree);
  }
  else {
    if (rpc_act_file == (char *)0x0) {
      parse_data_cold_2();
      return 1;
    }
    lVar4 = lyd_parse_path(ctx,rpc_act_file,informat,0x10,val_tree);
    if (lVar4 == 0) {
      parse_data_cold_1();
      return 1;
    }
    plVar5 = (lyd_node *)lyd_parse_path(ctx,filepath,informat,uVar7,lVar4,val_tree);
  }
LAB_00108e57:
  lyd_free_withsiblings(lVar4);
  piVar6 = (int *)ly_errno_glob_address();
  if (*piVar6 != 0) {
    parse_data_cold_9();
    return 1;
  }
  *result = plVar5;
  *options = uVar7;
  return 0;
}

Assistant:

static int
parse_data(char *filepath, LYD_FORMAT informat, int *options, struct lyd_node *val_tree, const char *rpc_act_file,
           struct lyd_node **result)
{
    struct lyxml_elem *xml = NULL;
    struct lyd_node *data = NULL, *rpc_act = NULL;
    int opts = *options;

    if (informat == LYD_UNKNOWN) {
        /* detect input format according to file suffix */
        informat = detect_data_format(filepath);
    }
    if (informat == LYD_UNKNOWN) {
        fprintf(stderr, "Unable to resolve format of the input file, please add \".xml\", \".json\", or \".lyb\" suffix.\n");
        return EXIT_FAILURE;
    }

    ly_errno = LY_SUCCESS;

    if ((opts & LYD_OPT_TYPEMASK) == LYD_OPT_TYPEMASK) {
        /* automatically detect data type from the data top level */
        if (informat != LYD_XML) {
            fprintf(stderr, "Only XML data can be automatically explored.\n");
            return EXIT_FAILURE;
        }

        xml = lyxml_parse_path(ctx, filepath, 0);
        if (!xml) {
            fprintf(stderr, "Failed to parse XML data for automatic type detection.\n");
            return EXIT_FAILURE;
        }

        /* NOTE: namespace is ignored to simplify usage of this feature */

        if (!strcmp(xml->name, "data")) {
            fprintf(stdout, "Parsing %s as complete datastore.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_ADD_YANGLIB;
        } else if (!strcmp(xml->name, "config")) {
            fprintf(stdout, "Parsing %s as config data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_CONFIG;
        } else if (!strcmp(xml->name, "get-reply")) {
            fprintf(stdout, "Parsing %s as <get> reply data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_GET;
        } else if (!strcmp(xml->name, "get-config-reply")) {
            fprintf(stdout, "Parsing %s as <get-config> reply data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_GETCONFIG;
        } else if (!strcmp(xml->name, "edit-config")) {
            fprintf(stdout, "Parsing %s as <edit-config> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_EDIT;
        } else if (!strcmp(xml->name, "rpc")) {
            fprintf(stdout, "Parsing %s as <rpc> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPC;
        } else if (!strcmp(xml->name, "rpc-reply")) {
            if (!rpc_act_file) {
                fprintf(stderr, "RPC/action reply data require additional argument (file with the RPC/action).\n");
                lyxml_free(ctx, xml);
                return EXIT_FAILURE;
            }
            fprintf(stdout, "Parsing %s as <rpc-reply> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPCREPLY;
            rpc_act = lyd_parse_path(ctx, rpc_act_file, informat, LYD_OPT_RPC, val_tree);
            if (!rpc_act) {
                fprintf(stderr, "Failed to parse RPC/action.\n");
                lyxml_free(ctx, xml);
                return EXIT_FAILURE;
            }
        } else if (!strcmp(xml->name, "notification")) {
            fprintf(stdout, "Parsing %s as <notification> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_NOTIF;
        } else if (!strcmp(xml->name, "yang-data")) {
            fprintf(stdout, "Parsing %s as <yang-data> data.\n", filepath);
            opts = (opts & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_TEMPLATE;
            if (!rpc_act_file) {
                fprintf(stderr, "YANG-DATA require additional argument (name instance of yang-data extension).\n");
                lyxml_free(ctx, xml);
                return EXIT_FAILURE;
            }
        } else {
            fprintf(stderr, "Invalid top-level element for automatic data type recognition.\n");
            lyxml_free(ctx, xml);
            return EXIT_FAILURE;
        }

        if (opts & LYD_OPT_RPCREPLY) {
            data = lyd_parse_xml(ctx, &xml->child, opts, rpc_act, val_tree);
        } else if (opts & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            data = lyd_parse_xml(ctx, &xml->child, opts, val_tree);
        } else if (opts & LYD_OPT_DATA_TEMPLATE) {
            data = lyd_parse_xml(ctx, &xml->child, opts, rpc_act_file);
        } else {
            data = lyd_parse_xml(ctx, &xml->child, opts);
        }
        lyxml_free(ctx, xml);
    } else {
        if (opts & LYD_OPT_RPCREPLY) {
            if (!rpc_act_file) {
                fprintf(stderr, "RPC/action reply data require additional argument (file with the RPC/action).\n");
                return EXIT_FAILURE;
            }
            rpc_act = lyd_parse_path(ctx, rpc_act_file, informat, LYD_OPT_RPC, val_tree);
            if (!rpc_act) {
                fprintf(stderr, "Failed to parse RPC/action.\n");
                return EXIT_FAILURE;
            }
            data = lyd_parse_path(ctx, filepath, informat, opts, rpc_act, val_tree);
        } else if (opts & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            data = lyd_parse_path(ctx, filepath, informat, opts, val_tree);
        } else if (opts & LYD_OPT_DATA_TEMPLATE) {
            if (!rpc_act_file) {
                fprintf(stderr, "YANG-DATA require additional argument (name instance of yang-data extension).\n");
                return EXIT_FAILURE;
            }
            data = lyd_parse_path(ctx, filepath, informat, opts, rpc_act_file);
        } else {
            if (!(opts & LYD_OPT_TYPEMASK)) {
                /* automatically add yang-library data */
                opts |= LYD_OPT_DATA_ADD_YANGLIB;
            }
            data = lyd_parse_path(ctx, filepath, informat, opts);
        }
    }
    lyd_free_withsiblings(rpc_act);

    if (ly_errno) {
        fprintf(stderr, "Failed to parse data.\n");
        lyd_free_withsiblings(data);
        return EXIT_FAILURE;
    }

    *result = data;
    *options = opts;
    return EXIT_SUCCESS;
}